

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_item_t_conflict
new_func(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,int vararg_p,
        __va_list_tag *argp)

{
  uint uVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  MIR_item_t_conflict pMVar5;
  size_t sVar6;
  long lVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  undefined4 *puVar10;
  uint uVar11;
  undefined8 auStack_50 [3];
  undefined4 *local_38;
  
  lVar3 = -(nargs * 0x18 + 0xf & 0xfffffffffffffff0);
  puVar4 = (undefined4 *)((long)&local_38 + lVar3);
  local_38 = puVar4;
  if (nargs != 0) {
    lVar7 = 0;
    uVar11 = argp->gp_offset;
    sVar6 = nargs;
    puVar10 = puVar4;
    do {
      puVar8 = puVar10;
      if (uVar11 < 0x29) {
        uVar1 = uVar11 + 8;
        argp->gp_offset = uVar1;
        *puVar10 = *(undefined4 *)((long)argp->reg_save_area + (ulong)uVar11);
        if (0x20 < uVar11) {
          puVar8 = puVar4 + lVar7 * 6;
          uVar11 = uVar1;
          goto LAB_00131be6;
        }
        puVar9 = (undefined8 *)((ulong)uVar1 + (long)argp->reg_save_area);
        uVar11 = uVar11 + 0x10;
        argp->gp_offset = uVar11;
      }
      else {
        puVar2 = (undefined4 *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar2 + 2;
        *puVar10 = *puVar2;
LAB_00131be6:
        puVar9 = (undefined8 *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar9 + 1;
      }
      lVar7 = lVar7 + 1;
      puVar10 = puVar10 + 6;
      sVar6 = sVar6 - 1;
      *(undefined8 *)(puVar8 + 2) = *puVar9;
    } while (sVar6 != 0);
  }
  *(undefined4 **)((long)auStack_50 + lVar3 + 8) = puVar4;
  *(undefined8 *)((long)auStack_50 + lVar3) = 0x131c13;
  pMVar5 = new_func_arr(ctx,name,nres,res_types,nargs,vararg_p,
                        *(MIR_var_t **)((long)auStack_50 + lVar3 + 8));
  return pMVar5;
}

Assistant:

static MIR_item_t new_func (MIR_context_t ctx, const char *name, size_t nres, MIR_type_t *res_types,
                            size_t nargs, int vararg_p, va_list argp) {
  size_t i;
  MIR_var_t *vars = alloca (sizeof (MIR_var_t) * nargs);

  for (i = 0; i < nargs; i++) {
    vars[i].type = va_arg (argp, MIR_type_t);
    vars[i].name = va_arg (argp, const char *);
  }
  return new_func_arr (ctx, name, nres, res_types, nargs, vararg_p, vars);
}